

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifier.cpp
# Opt level: O3

void __thiscall
vkt::texture::SampleVerifier::fetchTexel
          (SampleVerifier *this,IVec3 *coordIn,int layer,int level,VkFilter filter,Vec4 *resultMin,
          Vec4 *resultMax)

{
  ImgDim IVar1;
  int iVar2;
  VkBorderColor VVar3;
  SamplerParameters *pSVar4;
  bool bVar5;
  deInt32 dVar6;
  int iVar7;
  undefined8 *puVar8;
  pointer pCVar9;
  long lVar10;
  bool bVar11;
  long lVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  IVec3 coord;
  undefined8 local_c8;
  VkSamplerAddressMode local_c0;
  int iStack_bc;
  IVec2 cornerCoords [3];
  undefined1 local_98 [20];
  int faces [3];
  IVec2 newCoord;
  int aiStack_70 [2];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  int newFace;
  
  coord.m_data[2] = coordIn->m_data[2];
  coord.m_data._0_8_ = *(undefined8 *)coordIn->m_data;
  pSVar4 = this->m_samplerParams;
  local_c8._0_4_ = pSVar4->wrappingModeU;
  local_c8._4_4_ = pSVar4->wrappingModeV;
  local_c0 = pSVar4->wrappingModeW;
  bVar5 = ::vk::isSrgbFormat(this->m_imParams->format);
  IVar1 = this->m_imParams->dim;
  if (filter == VK_FILTER_LINEAR && IVar1 == IMG_DIM_CUBE) {
    faces[0] = layer % 6;
    iVar7 = coord.m_data[0];
    if (coord.m_data[0] < 0) {
      bVar11 = true;
      if (-1 < (long)coord.m_data._0_8_) goto LAB_007f9f95;
LAB_007fa0e5:
      pCVar9 = (this->m_levels->
               super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
               )._M_impl.super__Vector_impl_data._M_start;
    }
    else {
      iVar2 = (this->m_levels->
              super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
              )._M_impl.super__Vector_impl_data._M_start[level].m_size.m_data[0];
      bVar11 = iVar2 <= coord.m_data[0];
      if ((long)coord.m_data._0_8_ < 0) {
        bVar11 = true;
        if (coord.m_data[0] < iVar2) {
          pCVar9 = (this->m_levels->
                   super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          goto LAB_007f9fc1;
        }
LAB_007fa0bf:
        if ((this->m_levels->
            super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
            )._M_impl.super__Vector_impl_data._M_start[level].m_size.m_data[0] <= coord.m_data[0]) {
          if (bVar11) goto LAB_007fa0e5;
          goto LAB_007fa0f1;
        }
        goto LAB_007fa036;
      }
LAB_007f9f95:
      pCVar9 = (this->m_levels->
               super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (bVar11 != pCVar9[level].m_size.m_data[1] <= coord.m_data[1]) {
LAB_007f9fc1:
        newCoord.m_data[0] = 0;
        newCoord.m_data[1] = 0;
        newFace = 0;
        cornerCoords[0].m_data[0] = coord.m_data[0];
        cornerCoords[0].m_data[1] = coord.m_data[1];
        local_98._0_4_ = pCVar9[level].m_size.m_data[0];
        local_98._4_4_ = pCVar9[level].m_size.m_data[1];
        util::wrapCubemapEdge(cornerCoords,(IVec2 *)local_98,faces[0],&newCoord,&newFace);
        iVar7 = newCoord.m_data[0];
        coord.m_data[0] = newCoord.m_data[0];
        coord.m_data[1] = newCoord.m_data[1];
        layer = (layer / 6) * 6 + newFace;
        goto LAB_007fa032;
      }
      if (-1 < coord.m_data[0]) {
        bVar11 = false;
        goto LAB_007fa0bf;
      }
LAB_007fa0f1:
      pCVar9 = (this->m_levels->
               super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (coord.m_data[1] < pCVar9[level].m_size.m_data[1]) goto LAB_007fa032;
    }
    faces[1] = 0;
    faces[2] = 0;
    cornerCoords[2].m_data[0] = 0;
    cornerCoords[2].m_data[1] = 0;
    cornerCoords[0].m_data[0] = 0;
    cornerCoords[0].m_data[1] = 0;
    cornerCoords[1].m_data[0] = 0;
    cornerCoords[1].m_data[1] = 0;
    newCoord.m_data[0] = coord.m_data[0];
    newCoord.m_data[1] = coord.m_data[1];
    local_98._0_4_ = pCVar9[level].m_size.m_data[0];
    local_98._4_4_ = pCVar9[level].m_size.m_data[1];
    util::wrapCubemapCorner
              (&newCoord,(IVec2 *)local_98,faces[0],faces + 1,faces + 2,cornerCoords,
               cornerCoords + 1,cornerCoords + 2);
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    newCoord.m_data[0] = 0;
    newCoord.m_data[1] = 0;
    lVar12 = 1;
    do {
      if (bVar5) {
        tcu::ConstPixelBufferAccess::getPixel
                  ((ConstPixelBufferAccess *)&newFace,
                   (int)(this->m_levels->
                        super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                        )._M_impl.super__Vector_impl_data._M_start + level * 0x28,
                   (&iStack_bc)[lVar12],cornerCoords[0].m_data[lVar12]);
        tcu::sRGBToLinear((tcu *)local_98,(Vec4 *)&newFace);
      }
      else {
        tcu::ConstPixelBufferAccess::getPixel
                  ((ConstPixelBufferAccess *)local_98,
                   (int)(this->m_levels->
                        super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                        )._M_impl.super__Vector_impl_data._M_start + level * 0x28,
                   (&iStack_bc)[lVar12],cornerCoords[0].m_data[lVar12]);
      }
      fVar13 = (float)(&newCoord)[lVar12 + -1].m_data[1];
      fVar14 = (float)(&newCoord)[lVar12].m_data[0];
      fVar15 = (float)(&newCoord)[lVar12].m_data[1];
      faces[lVar12 * 2 + 1] = (int)((float)local_98._0_4_ + (float)faces[lVar12 * 2 + 1]);
      (&newCoord)[lVar12 + -1].m_data[1] = (int)((float)local_98._4_4_ + fVar13);
      (&newCoord)[lVar12].m_data[0] = (int)((float)local_98._8_4_ + fVar14);
      (&newCoord)[lVar12].m_data[1] = (int)((float)local_98._12_4_ + fVar15);
      lVar12 = lVar12 + 2;
    } while (lVar12 != 7);
    puVar8 = &local_68;
    lVar12 = 0;
    do {
      fVar13 = (float)newCoord.m_data[lVar12];
      lVar10 = 0;
      fVar14 = fVar13;
      do {
        fVar15 = *(float *)((long)puVar8 + lVar10);
        fVar13 = (float)(~-(uint)(fVar15 <= fVar13) & (uint)fVar13 |
                        -(uint)(fVar15 <= fVar13) & (uint)fVar15);
        fVar14 = (float)(~-(uint)(fVar14 <= fVar15) & (uint)fVar14 |
                        (uint)fVar15 & -(uint)(fVar14 <= fVar15));
        lVar10 = lVar10 + 0x10;
      } while (lVar10 != 0x20);
      resultMin->m_data[lVar12] = fVar13;
      resultMax->m_data[lVar12] = fVar14;
      lVar12 = lVar12 + 1;
      puVar8 = (undefined8 *)((long)puVar8 + 4);
    } while (lVar12 != 4);
  }
  else {
    if (IVar1 == IMG_DIM_CUBE) {
      local_c0 = VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE;
      local_c8 = 0x200000002;
    }
    lVar12 = 0;
    do {
      dVar6 = util::wrapTexelCoord
                        (coord.m_data[lVar12],
                         (this->m_levels->
                         super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                         )._M_impl.super__Vector_impl_data._M_start[level].m_size.m_data[lVar12],
                         *(VkSamplerAddressMode *)((long)&local_c8 + lVar12 * 4));
      coord.m_data[lVar12] = dVar6;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
    iVar7 = coord.m_data[0];
LAB_007fa032:
    if (-1 < iVar7) {
LAB_007fa036:
      pCVar9 = (this->m_levels->
               super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((((iVar7 < pCVar9[level].m_size.m_data[0]) && (-1 < (long)coord.m_data._0_8_)) &&
          (coord.m_data[1] < pCVar9[level].m_size.m_data[1])) &&
         ((-1 < coord.m_data[2] && (coord.m_data[2] < pCVar9[level].m_size.m_data[2])))) {
        fetchTexelWrapped(this,&coord,layer,level,resultMin,resultMax);
        return;
      }
    }
    VVar3 = this->m_samplerParams->borderColor;
    if (VVar3 == VK_BORDER_COLOR_FLOAT_OPAQUE_WHITE) {
      fVar13 = 1.0;
      fVar14 = 1.0;
      fVar15 = 1.0;
      fVar16 = 1.0;
    }
    else if (VVar3 == VK_BORDER_COLOR_FLOAT_OPAQUE_BLACK) {
      fVar13 = 0.0;
      fVar14 = 0.0;
      fVar15 = 0.0;
      fVar16 = 1.0;
    }
    else {
      if (VVar3 != VK_BORDER_COLOR_FLOAT_TRANSPARENT_BLACK) {
        return;
      }
      fVar13 = 0.0;
      fVar14 = 0.0;
      fVar15 = 0.0;
      fVar16 = 0.0;
    }
    resultMin->m_data[0] = fVar13;
    resultMin->m_data[1] = fVar14;
    resultMin->m_data[2] = fVar15;
    resultMin->m_data[3] = fVar16;
    resultMax->m_data[0] = fVar13;
    resultMax->m_data[1] = fVar14;
    resultMax->m_data[2] = fVar15;
    resultMax->m_data[3] = fVar16;
  }
  return;
}

Assistant:

void SampleVerifier::fetchTexel (const IVec3&	coordIn,
								 int			layer,
								 int			level,
								 VkFilter		filter,
								 Vec4&			resultMin,
								 Vec4&			resultMax) const
{
	IVec3 coord = coordIn;

	VkSamplerAddressMode wrappingModes[] =
	{
		m_samplerParams.wrappingModeU,
		m_samplerParams.wrappingModeV,
		m_samplerParams.wrappingModeW
	};

	const bool isSrgb = isSrgbFormat(m_imParams.format);

	// Wrapping operations


	if (m_imParams.dim == IMG_DIM_CUBE && filter == VK_FILTER_LINEAR)
	{
		// If the image is a cubemap and we are using linear filtering, we do edge or corner wrapping

		const int	arrayLayer = layer / 6;
		int			arrayFace  = layer % 6;

		if (coordOutOfRange(coord, 0, level) != coordOutOfRange(coord, 1, level))
		{
			// Wrap around edge

			IVec2	newCoord(0);
			int		newFace = 0;

			wrapCubemapEdge(coord.swizzle(0, 1),
							m_levels[level].getSize().swizzle(0, 1),
							arrayFace,
							newCoord,
							newFace);

			coord.xy()	= newCoord;
			layer		= arrayLayer * 6 + newFace;
		}
		else if (coordOutOfRange(coord, 0, level) && coordOutOfRange(coord, 1, level))
		{
			// Wrap corner

			int   faces[3] = {arrayFace, 0, 0};
			IVec2 cornerCoords[3];

			wrapCubemapCorner(coord.swizzle(0, 1),
							  m_levels[level].getSize().swizzle(0, 1),
							  arrayFace,
							  faces[1],
							  faces[2],
							  cornerCoords[0],
							  cornerCoords[1],
							  cornerCoords[2]);

			// \todo [2016-08-01 collinbaker] Call into fetchTexelWrapped instead

			Vec4 cornerTexels[3];

			for (int ndx = 0; ndx < 3; ++ndx)
			{
				int cornerLayer = faces[ndx] + arrayLayer * 6;

				if (isSrgb)
				{
				    cornerTexels[ndx] += sRGBToLinear(m_levels[level].getPixel(cornerCoords[ndx][0], cornerCoords[ndx][1], cornerLayer));
				}
				else
				{
					cornerTexels[ndx] += m_levels[level].getPixel(cornerCoords[ndx][0], cornerCoords[ndx][1], cornerLayer);
				}
			}

			for (int compNdx = 0; compNdx < 4; ++compNdx)
			{
				float compMin = cornerTexels[0][compNdx];
				float compMax = cornerTexels[0][compNdx];

				for (int ndx = 1; ndx < 3; ++ndx)
				{
					const float comp = cornerTexels[ndx][compNdx];

					compMin = de::min(comp, compMin);
					compMax = de::max(comp, compMax);
				}

				resultMin[compNdx] = compMin;
				resultMax[compNdx] = compMax;
			}

			return;
		}
		else
		{
			// If no wrapping is necessary, just do nothing
		}
	}
	else
	{
		// Otherwise, we do normal wrapping

		if (m_imParams.dim == IMG_DIM_CUBE)
		{
			wrappingModes[0] = wrappingModes[1] = wrappingModes[2] = VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE;
		}

		for (int compNdx = 0; compNdx < 3; ++compNdx)
		{
			const int size = m_levels[level].getSize()[compNdx];

			coord[compNdx] = wrapTexelCoord(coord[compNdx], size, wrappingModes[compNdx]);
		}
	}

	if (coordOutOfRange(coord, 0, level) ||
		coordOutOfRange(coord, 1, level) ||
		coordOutOfRange(coord, 2, level))
	{
		// If after wrapping coordinates are still out of range, perform texel replacement

		switch (m_samplerParams.borderColor)
		{
			case VK_BORDER_COLOR_FLOAT_TRANSPARENT_BLACK:
			{
				resultMin = Vec4(0.0f, 0.0f, 0.0f, 0.0f);
				resultMax = Vec4(0.0f, 0.0f, 0.0f, 0.0f);
				return;
			}
			case VK_BORDER_COLOR_FLOAT_OPAQUE_BLACK:
			{
				resultMin = Vec4(0.0f, 0.0f, 0.0f, 1.0f);
				resultMax = Vec4(0.0f, 0.0f, 0.0f, 1.0f);
				return;
			}
			case VK_BORDER_COLOR_FLOAT_OPAQUE_WHITE:
			{
				resultMin = Vec4(1.0f, 1.0f, 1.0f, 1.0f);
				resultMax = Vec4(1.0f, 1.0f, 1.0f, 1.0f);
				return;
			}
			default:
			{
				// \\ [2016-07-07 collinbaker] Handle
				// VK_BORDER_COLOR_INT_* borders
				DE_FATAL("Not implemented");
				break;
			}
		}
	}
	else
	{
		// Otherwise, actually fetch a texel

	    fetchTexelWrapped(coord, layer, level, resultMin, resultMax);
	}
}